

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int cm_zlib_deflateEnd(z_streamp strm)

{
  int iVar1;
  internal_state *piVar2;
  
  iVar1 = deflateStateCheck(strm);
  if (iVar1 == 0) {
    piVar2 = strm->state;
    iVar1 = piVar2->status;
    if (piVar2->pending_buf != (Bytef *)0x0) {
      (*strm->zfree)(strm->opaque,piVar2->pending_buf);
      piVar2 = strm->state;
    }
    if (piVar2->head != (Posf *)0x0) {
      (*strm->zfree)(strm->opaque,piVar2->head);
      piVar2 = strm->state;
    }
    if (piVar2->prev != (Posf *)0x0) {
      (*strm->zfree)(strm->opaque,piVar2->prev);
      piVar2 = strm->state;
    }
    if (piVar2->window != (Bytef *)0x0) {
      (*strm->zfree)(strm->opaque,piVar2->window);
      piVar2 = strm->state;
    }
    (*strm->zfree)(strm->opaque,piVar2);
    strm->state = (internal_state *)0x0;
    iVar1 = (uint)(iVar1 != 0x71) * 3 + -3;
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int ZEXPORT deflateEnd(z_streamp strm) {
    int status;

    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;

    status = strm->state->status;

    /* Deallocate in reverse order of allocations: */
    TRY_FREE(strm, strm->state->pending_buf);
    TRY_FREE(strm, strm->state->head);
    TRY_FREE(strm, strm->state->prev);
    TRY_FREE(strm, strm->state->window);

    ZFREE(strm, strm->state);
    strm->state = Z_NULL;

    return status == BUSY_STATE ? Z_DATA_ERROR : Z_OK;
}